

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void ts_stack_record_summary(Stack *self,StackVersion version,uint max_depth)

{
  uint uVar1;
  StackNode *pSVar2;
  StackNode *pSVar3;
  Subtree *pSVar4;
  long lVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined3 uVar9;
  undefined4 original_version;
  _Bool _Var10;
  StackIterator *pSVar11;
  StackLink *pSVar12;
  bool local_119;
  StackSummary *local_108;
  SummarizeStackSession session;
  uint max_depth_local;
  StackVersion version_local;
  Stack *self_local;
  StackIterator current_iterator;
  StackLink link;
  StackIterator *next_iterator;
  undefined1 auStack_a0 [4];
  uint32_t j;
  SubtreeArray subtrees;
  _Bool should_stop;
  _Bool should_pop;
  StackAction action;
  StackNode *node;
  StackIterator *iterator_1;
  uint local_70;
  uint32_t size;
  uint32_t i;
  _Bool include_subtrees;
  StackIterator iterator;
  StackHead *head;
  
  session.max_depth = max_depth;
  session._12_4_ = version;
  local_108 = (StackSummary *)ts_malloc(0x10);
  original_version = session._12_4_;
  session.summary._0_4_ = session.max_depth;
  local_108->size = 0;
  local_108->capacity = 0;
  local_108->contents = (StackSummaryEntry *)0x0;
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= (uint)session._12_4_) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  pSVar2 = (self->heads).contents[(uint)session._12_4_].node;
  iterator.subtrees.capacity = CONCAT31(iterator.subtrees.capacity._1_3_,1);
  array__grow((VoidArray *)&self->iterators,0x20);
  uVar1 = (self->iterators).size;
  (self->iterators).size = uVar1 + 1;
  pSVar11 = (self->iterators).contents + uVar1;
  pSVar11->node = pSVar2;
  (pSVar11->subtrees).contents = (Subtree *)0x0;
  (pSVar11->subtrees).size = 0;
  (pSVar11->subtrees).capacity = 0;
  lVar5 = (ulong)iterator.subtrees.capacity << 0x20;
  pSVar11->subtree_count = (int)lVar5;
  pSVar11->is_pending = (_Bool)(char)((ulong)lVar5 >> 0x20);
  *(int3 *)&pSVar11->field_0x1d = (int3)((ulong)lVar5 >> 0x28);
  do {
    if ((self->iterators).size == 0) {
      (self->heads).contents[(uint)session._12_4_].summary = local_108;
      return;
    }
    local_70 = 0;
    iterator_1._4_4_ = (self->iterators).size;
    for (; local_70 < iterator_1._4_4_; local_70 = local_70 + 1) {
      pSVar11 = (self->iterators).contents + local_70;
      pSVar2 = pSVar11->node;
      subtrees.capacity = summarize_stack_callback(&local_108,pSVar11);
      subtrees.size._3_1_ = (subtrees.capacity & 2) != 0;
      local_119 = true;
      if ((subtrees.capacity & 1) == 0) {
        local_119 = pSVar2->link_count == 0;
      }
      subtrees.size._2_1_ = local_119;
      if ((bool)subtrees.size._3_1_) {
        _auStack_a0 = (pSVar11->subtrees).contents;
        subtrees.contents = *(Subtree **)&(pSVar11->subtrees).size;
        if (local_119 == false) {
          ts_subtree_array_copy(pSVar11->subtrees,(SubtreeArray *)auStack_a0);
        }
        ts_subtree_array_reverse((SubtreeArray *)auStack_a0);
        ts_stack__add_slice(self,original_version,pSVar2,(SubtreeArray *)auStack_a0);
      }
      if ((subtrees.size._2_1_ & 1) == 0) {
        for (next_iterator._4_4_ = 1; next_iterator._4_4_ <= pSVar2->link_count;
            next_iterator._4_4_ = next_iterator._4_4_ + 1) {
          if (next_iterator._4_4_ == pSVar2->link_count) {
            current_iterator._24_8_ = pSVar2->links[0].node;
            link.node = (StackNode *)pSVar2->links[0].subtree.ptr;
            link.subtree = *(Subtree *)&pSVar2->links[0].is_pending;
            link._16_8_ = (self->iterators).contents + local_70;
LAB_00130fca:
            *(undefined8 *)link._16_8_ = current_iterator._24_8_;
            if (link.node == (StackNode *)0x0) {
              *(int *)(link._16_8_ + 0x18) = *(int *)(link._16_8_ + 0x18) + 1;
              *(undefined1 *)(link._16_8_ + 0x1c) = 0;
            }
            else {
              _Var10 = ts_subtree_extra((Subtree)link.node);
              if ((!_Var10) &&
                 (*(int *)(link._16_8_ + 0x18) = *(int *)(link._16_8_ + 0x18) + 1,
                 ((ulong)link.subtree.ptr & 1) == 0)) {
                *(undefined1 *)(link._16_8_ + 0x1c) = 0;
              }
            }
          }
          else if ((self->iterators).size < 0x40) {
            pSVar12 = pSVar2->links + next_iterator._4_4_;
            current_iterator._24_8_ = pSVar12->node;
            link.node = (StackNode *)(pSVar12->subtree).ptr;
            link.subtree = *(Subtree *)&pSVar12->is_pending;
            pSVar11 = (self->iterators).contents + local_70;
            pSVar3 = pSVar11->node;
            pSVar4 = (pSVar11->subtrees).contents;
            uVar6 = (pSVar11->subtrees).size;
            uVar7 = (pSVar11->subtrees).capacity;
            uVar8 = pSVar11->subtree_count;
            _Var10 = pSVar11->is_pending;
            uVar9 = *(undefined3 *)&pSVar11->field_0x1d;
            array__grow((VoidArray *)&self->iterators,0x20);
            uVar1 = (self->iterators).size;
            (self->iterators).size = uVar1 + 1;
            pSVar11 = (self->iterators).contents + uVar1;
            pSVar11->node = pSVar3;
            (pSVar11->subtrees).contents = pSVar4;
            (pSVar11->subtrees).size = uVar6;
            (pSVar11->subtrees).capacity = uVar7;
            pSVar11->subtree_count = uVar8;
            pSVar11->is_pending = _Var10;
            *(undefined3 *)&pSVar11->field_0x1d = uVar9;
            if ((self->iterators).size <= (self->iterators).size - 1) {
              __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x151,
                            "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                           );
            }
            link._16_8_ = (self->iterators).contents + ((self->iterators).size - 1);
            ts_subtree_array_copy
                      (((StackIterator *)link._16_8_)->subtrees,
                       &((StackIterator *)link._16_8_)->subtrees);
            goto LAB_00130fca;
          }
        }
      }
      else {
        if ((subtrees.size._3_1_ & 1) == 0) {
          ts_subtree_array_delete(self->subtree_pool,&pSVar11->subtrees);
        }
        array__erase((VoidArray *)&self->iterators,0x20,local_70);
        local_70 = local_70 - 1;
        iterator_1._4_4_ = iterator_1._4_4_ - 1;
      }
    }
  } while( true );
}

Assistant:

void ts_stack_record_summary(Stack *self, StackVersion version, unsigned max_depth) {
  SummarizeStackSession session = {
    .summary = ts_malloc(sizeof(StackSummary)),
    .max_depth = max_depth
  };
  array_init(session.summary);
  stack__iter(self, version, summarize_stack_callback, &session, -1);
  self->heads.contents[version].summary = session.summary;
}